

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::eliminate_noop(NetOptimize *this)

{
  int iVar1;
  pointer ppLVar2;
  pointer ppLVar3;
  Layer *pLVar4;
  int *piVar5;
  pointer ppLVar6;
  Layer *pLVar7;
  pointer piVar8;
  long lVar9;
  long lVar10;
  pointer pBVar11;
  bool bVar12;
  long lVar13;
  ulong uVar14;
  int k;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long local_58;
  long local_50;
  
  ppLVar2 = (this->super_Net).layers.
            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppLVar3 = (this->super_Net).layers.
            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_50 = -1;
  local_58 = -0x100000000;
  lVar13 = 0;
  do {
    if (lVar13 == (long)ppLVar2 - (long)ppLVar3 >> 3) {
      return 0;
    }
    bVar12 = std::operator!=(&(this->super_Net).layers.
                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                              _M_impl.super__Vector_impl_data._M_start[lVar13]->type,"Noop");
    if (!bVar12) {
      pLVar4 = (this->super_Net).layers.
               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
               super__Vector_impl_data._M_start[lVar13];
      piVar5 = (pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (piVar5 == *(pointer *)
                     ((long)&(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl
                     + 8)) {
        fprintf(_stderr,"eliminate_noop %s\n",(pLVar4->name)._M_dataplus._M_p);
        lVar16 = *(long *)&(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data;
        piVar8 = *(pointer *)
                  ((long)&(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
        pBVar11 = (this->super_Net).blobs.
                  super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                  super__Vector_impl_data._M_start;
        for (lVar17 = 0; (long)piVar8 - lVar16 >> 2 != lVar17; lVar17 = lVar17 + 1) {
          pBVar11[*(int *)(lVar16 + lVar17 * 4)].producer = -1;
        }
LAB_00116c8e:
        std::__cxx11::string::assign((char *)&pLVar4->type);
      }
      else {
        iVar1 = *piVar5;
        lVar17 = local_58;
        for (lVar16 = local_50; lVar16 != -1 && -1 < lVar16 + 1; lVar16 = lVar16 + -1) {
          bVar12 = std::operator==(&(this->super_Net).layers.
                                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar16]->type,
                                   "ncnnfused");
          if (!bVar12) {
            ppLVar6 = (this->super_Net).layers.
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar7 = ppLVar6[lVar16];
            piVar5 = (pLVar7->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (((long)*(pointer *)
                        ((long)&(pLVar7->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl
                        + 8) - (long)piVar5 != 4) || (*piVar5 != iVar1)) goto LAB_00116bc7;
            lVar17 = *(long *)((long)ppLVar6 + (lVar17 >> 0x1d));
            fprintf(_stderr,"eliminate_noop %s %s\n",*(undefined8 *)(lVar17 + 0x38),
                    (pLVar4->name)._M_dataplus._M_p);
            lVar9 = *(long *)&(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data;
            uVar15 = (long)*(pointer *)
                            ((long)&(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl + 8) - lVar9 >> 2;
            lVar10 = *(long *)(lVar17 + 0x70);
            uVar14 = *(long *)(lVar17 + 0x78) - lVar10 >> 2;
            if (uVar15 <= uVar14) {
              uVar14 = uVar15;
            }
            pBVar11 = (this->super_Net).blobs.
                      super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                      super__Vector_impl_data._M_start;
            for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
              iVar1 = *(int *)(lVar9 + uVar15 * 4);
              *(int *)(lVar10 + uVar15 * 4) = iVar1;
              pBVar11[iVar1].producer = (int)lVar16;
            }
            goto LAB_00116c8e;
          }
LAB_00116bc7:
          lVar17 = lVar17 + -0x100000000;
        }
      }
    }
    lVar13 = lVar13 + 1;
    local_50 = local_50 + 1;
    local_58 = local_58 + 0x100000000;
  } while( true );
}

Assistant:

int NetOptimize::eliminate_noop()
{
    const size_t layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "Noop")
            continue;

        ncnn::Layer* noop = layers[i];

        if (noop->bottoms.empty())
        {
            // Noop
            fprintf(stderr, "eliminate_noop %s\n", noop->name.c_str());

            size_t top_blob_count = noop->tops.size();
            for (int k=0; k<top_blob_count; k++)
            {
                int top_blob_index_final = noop->tops[k];
                blobs[top_blob_index_final].producer = -1;
            }
            noop->type = "ncnnfused";

            continue;
        }

        // Any - Noop
        int bottom_blob_index = layers[i]->bottoms[0];

        int j = i - 1;
        for (; j>=0; j--)
        {
            if (layers[j]->type == "ncnnfused")
                continue;

            if (layers[j]->tops.size() != 1)
                continue;

            if (layers[j]->tops[0] == bottom_blob_index)
                break;
        }

        if (j == -1)
            continue;

        ncnn::Layer* any = layers[j];

        fprintf(stderr, "eliminate_noop %s %s\n", any->name.c_str(), noop->name.c_str());

        size_t top_blob_count = std::min(noop->tops.size(), any->tops.size());
        for (int k=0; k<top_blob_count; k++)
        {
            int top_blob_index_final = noop->tops[k];
            any->tops[k] = top_blob_index_final;
            blobs[top_blob_index_final].producer = j;
        }
        noop->type = "ncnnfused";
    }

    return 0;
}